

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O3

void __thiscall
FastPForLib::
CompositeCodec<FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
::~CompositeCodec(CompositeCodec<FastPForLib::SIMDSimplePFor<FastPForLib::Simple8b<true>_>,_FastPForLib::VariableByte>
                  *this)

{
  pointer puVar1;
  pointer puVar2;
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c6d30;
  (this->codec1).super_IntegerCODEC._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001c6da0;
  puVar1 = (this->codec1).bytescontainer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar2 = (this->codec1).datatobepacked.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}